

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

Function * __thiscall soul::PoolAllocator::allocate<soul::heart::Function>(PoolAllocator *this)

{
  PoolItem *pPVar1;
  
  pPVar1 = allocateSpaceForObject(this,0xe0);
  memset(&pPVar1->item,0,0xe0);
  pPVar1->item = &PTR__Function_002dad40;
  pPVar1[1].destructor = (DestructorFn *)0x0;
  pPVar1[1].item = (void *)0x0;
  *(undefined8 *)&pPVar1[1].field_0x18 = 0;
  pPVar1[2].size = 0;
  pPVar1[2].destructor = (DestructorFn *)(pPVar1 + 3);
  pPVar1[2].item = (void *)0x0;
  *(undefined8 *)&pPVar1[2].field_0x18 = 4;
  pPVar1[4].size = 0;
  pPVar1[4].destructor = (DestructorFn *)0x0;
  pPVar1[4].item = (void *)0x0;
  *(undefined8 *)&pPVar1[4].field_0x18 = 0;
  pPVar1[5].size = (size_t)&PTR__StringDictionary_002d3a30;
  pPVar1[5].destructor = (DestructorFn *)0x0;
  pPVar1[5].item = (void *)0x0;
  *(undefined8 *)&pPVar1[5].field_0x18 = 0;
  *(undefined4 *)&pPVar1[6].size = 1;
  *(undefined4 *)&pPVar1[6].destructor = 0;
  pPVar1[7].destructor = (DestructorFn *)0x0;
  pPVar1[6].item = (void *)0x0;
  *(undefined8 *)&pPVar1[6].field_0x18 = 0;
  *(undefined8 *)&pPVar1[6].field_0x1f = 0;
  pPVar1->destructor = allocate<soul::heart::Function>::anon_class_1_0_00000001::__invoke;
  return (Function *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }